

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ptrlist.c
# Opt level: O1

void raviX_ptrlist_iter_remove(PtrListIterator *self)

{
  void **ppvVar1;
  char cVar2;
  PtrList *pPVar3;
  
  if (-1 < (long)self->__nr) {
    pPVar3 = self->__list;
    cVar2 = *(char *)pPVar3;
    for (ppvVar1 = pPVar3->list_ + self->__nr; ppvVar1 < pPVar3->list_ + (long)cVar2 + -1;
        ppvVar1 = ppvVar1 + 1) {
      *ppvVar1 = ppvVar1[1];
    }
    *ppvVar1 = (void *)0xf0f0f0f0;
    *(char *)self->__list = *(char *)self->__list + -1;
    self->__nr = self->__nr + -1;
    return;
  }
  __assert_fail("self->__nr >= 0",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/ravicomp/src/ptrlist.c"
                ,0x93,"void raviX_ptrlist_iter_remove(PtrListIterator *)");
}

Assistant:

void raviX_ptrlist_iter_remove(PtrListIterator *self)
{
	assert(self->__nr >= 0);
	void **__this = self->__list->list_ + self->__nr;
	void **__last = self->__list->list_ + self->__list->nr_ - 1;
	while (__this < __last) {
		__this[0] = __this[1];
		__this++;
	}
	*__this = (void *)((uintptr_t)0xf0f0f0f0);
	self->__list->nr_--;
	self->__nr--;
}